

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_abdl_u16_arm(uint32_t a,uint32_t b)

{
  uint uVar1;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  uint32_t tmp_y_3;
  uint32_t tmp_x_3;
  uint32_t tmp_y_2;
  uint32_t tmp_x_2;
  uint32_t tmp_y_1;
  uint32_t tmp_x_1;
  uint32_t tmp_y;
  uint32_t tmp_x;
  uint64_t result;
  uint64_t tmp;
  uint32_t b_local;
  uint32_t a_local;
  
  local_44 = a & 0xff;
  uVar1 = b & 0xff;
  if (uVar1 < local_44) {
    local_44 = local_44 - uVar1;
  }
  else {
    local_44 = uVar1 - local_44;
  }
  local_48 = a >> 8 & 0xff;
  uVar1 = b >> 8 & 0xff;
  if (uVar1 < local_48) {
    local_48 = local_48 - uVar1;
  }
  else {
    local_48 = uVar1 - local_48;
  }
  local_4c = a >> 0x10 & 0xff;
  uVar1 = b >> 0x10 & 0xff;
  if (uVar1 < local_4c) {
    local_4c = local_4c - uVar1;
  }
  else {
    local_4c = uVar1 - local_4c;
  }
  local_50 = a >> 0x18;
  uVar1 = b >> 0x18;
  if (uVar1 < local_50) {
    local_50 = local_50 - uVar1;
  }
  else {
    local_50 = uVar1 - local_50;
  }
  return (ulong)local_50 << 0x30 |
         (ulong)local_4c << 0x20 | (ulong)local_48 << 0x10 | (ulong)local_44;
}

Assistant:

uint64_t HELPER(neon_abdl_u16)(uint32_t a, uint32_t b)
{
    uint64_t tmp;
    uint64_t result;
    DO_ABD(result, a, b, uint8_t, uint32_t);
    DO_ABD(tmp, a >> 8, b >> 8, uint8_t, uint32_t);
    result |= tmp << 16;
    DO_ABD(tmp, a >> 16, b >> 16, uint8_t, uint32_t);
    result |= tmp << 32;
    DO_ABD(tmp, a >> 24, b >> 24, uint8_t, uint32_t);
    result |= tmp << 48;
    return result;
}